

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

__m128i skinnycleanm128(__m128i x,int *mask16)

{
  ulong uVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  
  auVar2[8] = 0x21;
  auVar2._0_8_ = 0x2121212121212121;
  auVar2[9] = 0x21;
  auVar2[10] = 0x21;
  auVar2[0xb] = 0x21;
  auVar2[0xc] = 0x21;
  auVar2[0xd] = 0x21;
  auVar2[0xe] = 0x21;
  auVar2[0xf] = 0x21;
  uVar1 = vpcmpub_avx512vl(in_ZMM0._0_16_,auVar2,1);
  *(uint *)x[0] = (uint)uVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = thintable_epi8[uVar1 & 0xff];
  auVar2 = vmovhps_avx(auVar3,thintable_epi8[(uint)uVar1 >> 8]);
  auVar2 = vpaddb_avx(auVar2,_DAT_00195150);
  alVar4[0] = (ulong)""[uVar1 & 0xff];
  auVar2 = vpshufb_avx(in_ZMM0._0_16_,auVar2);
  vpshufb_avx(auVar2,*(undefined1 (*) [16])("" + alVar4[0] * 8));
  alVar4[1]._0_1_ = (char)uVar1;
  alVar4[1]._1_7_ = 0;
  return alVar4;
}

Assistant:

__m128i skinnycleanm128(__m128i x, int *mask16) {
  __m128i constant = _mm_set1_epi8((char)(0xFF - 0x21));
  __m128i satadd = _mm_adds_epu8(x,constant);// anything >=0x21 will sum to 0xFF, rest is just under
  __m128i ones = _mm_set1_epi8(1);
  __m128i sataddplusone = _mm_add_epi8(satadd,ones);// 0xFF + 1 = 0
  int mask =  _mm_movemask_epi8(sataddplusone);
  *mask16 = mask;
  int mask1 = mask & 0xFF;
  int mask2 = (mask >> 8) & 0xFF;
  __m128i shufmask = _mm_castps_si128(_mm_loadh_pi(
        _mm_castsi128_ps(
          _mm_loadl_epi64((const __m128i *)(thintable_epi8 + mask1))
        ),
        (const __m64 *)(thintable_epi8 + mask2)
  ));
  shufmask = _mm_add_epi8(shufmask, _mm_set_epi32(0x08080808, 0x08080808, 0, 0));
  __m128i pruned = _mm_shuffle_epi8(x, shufmask);
  intptr_t popx2 = BitsSetTable256mul2[mask1];
  __m128i compactmask = _mm_loadu_si128((const __m128i*)(pshufb_combine_table + popx2*8));
  return _mm_shuffle_epi8(pruned, compactmask);
}